

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

int zip_resolve_symlink(PHYSFS_Io *io,ZIPinfo *info,ZIPentry *entry)

{
  char cVar1;
  size_t _len;
  ulong len;
  ZIPinfo *info_00;
  mz_alloc_func p_Var2;
  mz_free_func p_Var3;
  int iVar4;
  uint uVar5;
  char *__s;
  uchar *buf;
  char *pcVar6;
  char *__dest;
  size_t sVar7;
  char *pcVar8;
  ZIPentry *entry_00;
  uint extraout_EDX;
  undefined1 *puVar9;
  undefined1 *puVar10;
  char *pcVar11;
  char *pcVar12;
  undefined1 auStack_b8 [8];
  mz_stream stream;
  
  puVar10 = auStack_b8;
  _len = entry->uncompressed_size;
  iVar4 = (*io->seek)(io,entry->offset);
  if (iVar4 == 0) {
    return 0;
  }
  if (_len + 1 < 0x100) {
    puVar10 = auStack_b8 + -(_len + 0x18 & 0xfffffffffffffff0);
    puVar9 = puVar10;
  }
  else {
    puVar9 = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar10 + -8) = 0x116e2c;
  __s = (char *)__PHYSFS_initSmallAlloc(puVar9,_len + 1);
  if (__s == (char *)0x0) {
    *(undefined8 *)(puVar10 + -8) = 0x116e6c;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    return 0;
  }
  stream.reserved = (mz_ulong)info;
  if (entry->compression_method == 0) {
    *(undefined8 *)(puVar10 + -8) = 0x116e82;
    uVar5 = __PHYSFS_readAll(io,__s,_len);
  }
  else {
    len = entry->compressed_size;
    uVar5 = 0;
    if (len < 0x100) {
      puVar10 = puVar10 + -(len + 0x17 & 0xfffffffffffffff0);
      puVar9 = puVar10;
    }
    else {
      puVar9 = (undefined1 *)0x0;
    }
    *(undefined8 *)(puVar10 + -8) = 0x116e94;
    buf = (uchar *)__PHYSFS_initSmallAlloc(puVar9,len);
    if (buf != (uchar *)0x0) {
      *(undefined8 *)(puVar10 + -8) = 0x116eb0;
      iVar4 = __PHYSFS_readAll(io,buf,len);
      uVar5 = 0;
      if (iVar4 != 0) {
        stream.msg = (char *)0x0;
        stream.data_type = 0;
        stream._92_4_ = 0;
        stream.adler = 0;
        stream.state = (mz_internal_state *)zlibPhysfsAlloc;
        stream.zalloc = zlibPhysfsFree;
        stream.zfree = (mz_free_func)&__PHYSFS_AllocatorHooks;
        stream.next_in = (uchar *)(len & 0xffffffff);
        stream.next_out = (uchar *)(_len & 0xffffffff);
        stream.opaque = (void *)0x0;
        stream.avail_in = 0;
        stream._12_4_ = 0;
        stream.avail_out = 0;
        stream._36_4_ = 0;
        stream.total_out = 0;
        auStack_b8 = (undefined1  [8])buf;
        stream.total_in = (mz_ulong)__s;
        *(undefined8 *)(puVar10 + -8) = 0x116f48;
        pcVar6 = (char *)(*__PHYSFS_AllocatorHooks.Malloc)(0xab10);
        if (pcVar6 == (char *)0x0) {
          *(undefined8 *)(puVar10 + -8) = 0x116fd5;
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        }
        else {
          pcVar6[0] = '\0';
          pcVar6[1] = '\0';
          pcVar6[2] = '\0';
          pcVar6[3] = '\0';
          pcVar6[11000] = '\0';
          pcVar6[0x2af9] = '\0';
          pcVar6[0x2afa] = '\0';
          pcVar6[0x2afb] = '\0';
          pcVar6[0x2afc] = '\0';
          pcVar6[0x2afd] = '\0';
          pcVar6[0x2afe] = '\0';
          pcVar6[0x2aff] = '\0';
          pcVar6[0xab0c] = '\x01';
          pcVar6[0xab0d] = '\0';
          pcVar6[0xab0e] = '\0';
          pcVar6[0xab0f] = '\0';
          pcVar6[0x2b00] = '\x01';
          pcVar6[0x2b01] = '\0';
          pcVar6[0x2b02] = '\0';
          pcVar6[0x2b03] = '\0';
          pcVar6[0x2b04] = '\0';
          pcVar6[0x2b05] = '\0';
          pcVar6[0x2b06] = '\0';
          pcVar6[0x2b07] = '\0';
          pcVar6[0x2b08] = -0xf;
          pcVar6[0x2b09] = -1;
          pcVar6[0x2b0a] = -1;
          pcVar6[0x2b0b] = -1;
          stream.msg = pcVar6;
          *(undefined8 *)(puVar10 + -8) = 0x116f8f;
          PHYSFS_setErrorCode(PHYSFS_ERR_OK);
          *(undefined8 *)(puVar10 + -8) = 0x116f9c;
          uVar5 = mz_inflate((mz_streamp)auStack_b8,4);
          *(undefined8 *)(puVar10 + -8) = 0x116fa6;
          zlib_err(uVar5);
          p_Var3 = stream.zfree;
          p_Var2 = stream.zalloc;
          pcVar6 = stream.msg;
          if (stream.msg != (char *)0x0) {
            *(undefined8 *)(puVar10 + -8) = 0x116fb6;
            (*p_Var2)(p_Var3,(uint)pcVar6,extraout_EDX);
            stream.msg = (char *)0x0;
          }
          uVar5 = (uint)(uVar5 < 2);
        }
      }
      *(undefined8 *)(puVar10 + -8) = 0x116fde;
      __PHYSFS_smallFree(buf);
    }
  }
  if (uVar5 == 0) goto LAB_00117126;
  __s[entry->uncompressed_size] = '\0';
  pcVar6 = __s;
  if (entry->version < 0x100) {
    do {
      if (*pcVar6 == '\\') {
        *pcVar6 = '/';
      }
      else if (*pcVar6 == '\0') break;
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  *(undefined8 *)(puVar10 + -8) = 0x11701e;
  __dest = strchr(__s,0x2f);
  pcVar6 = __s;
  info_00 = (ZIPinfo *)stream.reserved;
  while (stream.reserved = (mz_ulong)info_00, __dest != (char *)0x0) {
    if (__dest[1] == '.') {
      cVar1 = __dest[2];
      pcVar11 = __dest;
      if (cVar1 == '\0') {
        *__dest = '\0';
      }
      else if (cVar1 == '.') {
        pcVar12 = pcVar6;
        if (__dest[3] == '/') {
          *(undefined8 *)(puVar10 + -8) = 0x11707d;
          sVar7 = strlen(__dest + 4);
          *(undefined8 *)(puVar10 + -8) = 0x11708c;
          memmove(pcVar6,__dest + 4,sVar7 + 1);
          pcVar11 = pcVar6;
          do {
            pcVar8 = pcVar11;
            __dest = pcVar6;
            pcVar12 = __s;
            if (pcVar8 == __s) break;
            pcVar11 = pcVar8 + -1;
            pcVar12 = pcVar8;
          } while (pcVar8[-1] != '/');
        }
        pcVar11 = __dest;
        pcVar6 = pcVar12;
        if (__dest[3] == '\0') {
          *pcVar12 = '\0';
        }
      }
      else if (cVar1 == '/') {
        *(undefined8 *)(puVar10 + -8) = 0x117053;
        sVar7 = strlen(__dest + 2);
        *(undefined8 *)(puVar10 + -8) = 0x117062;
        memmove(__dest,__dest + 2,sVar7 + 1);
      }
    }
    else {
      pcVar11 = __dest + 1;
      pcVar6 = __dest;
    }
    *(undefined8 *)(puVar10 + -8) = 0x1170c0;
    __dest = strchr(pcVar11,0x2f);
    info_00 = (ZIPinfo *)stream.reserved;
  }
  *(undefined8 *)(puVar10 + -8) = 0x1170f7;
  entry_00 = (ZIPentry *)__PHYSFS_DirTreeFind(&info_00->tree,__s);
  if (entry_00 == (ZIPentry *)0x0) {
LAB_0011711f:
    entry_00 = (ZIPentry *)0x0;
  }
  else {
    *(undefined8 *)(puVar10 + -8) = 0x11710e;
    iVar4 = zip_resolve(io,info_00,entry_00);
    if (iVar4 == 0) goto LAB_0011711f;
    if (entry_00->symlink != (ZIPentry *)0x0) {
      entry_00 = entry_00->symlink;
    }
  }
  entry->symlink = entry_00;
LAB_00117126:
  *(undefined8 *)(puVar10 + -8) = 0x11712e;
  __PHYSFS_smallFree(__s);
  return (uint)(entry->symlink != (_ZIPentry *)0x0);
}

Assistant:

static int zip_resolve_symlink(PHYSFS_Io *io, ZIPinfo *info, ZIPentry *entry)
{
    const size_t size = (size_t) entry->uncompressed_size;
    char *path = NULL;
    int rc = 0;

    /*
     * We've already parsed the local file header of the symlink at this
     *  point. Now we need to read the actual link from the file data and
     *  follow it.
     */

    BAIL_IF_ERRPASS(!io->seek(io, entry->offset), 0);

    path = (char *) __PHYSFS_smallAlloc(size + 1);
    BAIL_IF(!path, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    
    if (entry->compression_method == COMPMETH_NONE)
        rc = __PHYSFS_readAll(io, path, size);

    else  /* symlink target path is compressed... */
    {
        z_stream stream;
        const size_t complen = (size_t) entry->compressed_size;
        PHYSFS_uint8 *compressed = (PHYSFS_uint8*) __PHYSFS_smallAlloc(complen);
        if (compressed != NULL)
        {
            if (__PHYSFS_readAll(io, compressed, complen))
            {
                initializeZStream(&stream);
                stream.next_in = compressed;
                stream.avail_in = (unsigned int) complen;
                stream.next_out = (unsigned char *) path;
                stream.avail_out = (unsigned int) size;
                if (zlib_err(inflateInit2(&stream, -MAX_WBITS)) == Z_OK)
                {
                    rc = zlib_err(inflate(&stream, Z_FINISH));
                    inflateEnd(&stream);

                    /* both are acceptable outcomes... */
                    rc = ((rc == Z_OK) || (rc == Z_STREAM_END));
                } /* if */
            } /* if */
            __PHYSFS_smallFree(compressed);
        } /* if */
    } /* else */

    if (rc)
    {
        path[entry->uncompressed_size] = '\0';    /* null-terminate it. */
        zip_convert_dos_path(entry->version, path);
        entry->symlink = zip_follow_symlink(io, info, path);
    } /* else */

    __PHYSFS_smallFree(path);

    return (entry->symlink != NULL);
}